

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed-solomon.c
# Opt level: O0

void correct_reed_solomon_destroy(correct_reed_solomon *rs)

{
  field_t field;
  polynomial_t polynomial;
  polynomial_t polynomial_00;
  polynomial_t polynomial_01;
  polynomial_t polynomial_02;
  polynomial_t polynomial_03;
  polynomial_t polynomial_04;
  polynomial_t polynomial_05;
  polynomial_t polynomial_06;
  polynomial_t polynomial_07;
  polynomial_t polynomial_08;
  polynomial_t polynomial_09;
  polynomial_t polynomial_10;
  void *in_RDI;
  field_operation_t i_1;
  uint i;
  unkbyte10 in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff2;
  ushort uVar1;
  undefined4 in_stack_fffffffffffffff4;
  uint uVar2;
  
  field.log._2_2_ = in_stack_fffffffffffffff2;
  field._0_10_ = in_stack_ffffffffffffffe8;
  field.log._4_4_ = in_stack_fffffffffffffff4;
  field_destroy(field);
  polynomial.order._2_2_ = in_stack_fffffffffffffff2;
  polynomial._0_10_ = in_stack_ffffffffffffffe8;
  polynomial._12_4_ = in_stack_fffffffffffffff4;
  polynomial_destroy(polynomial);
  free(*(void **)((long)in_RDI + 0x40));
  polynomial_00.order._2_2_ = in_stack_fffffffffffffff2;
  polynomial_00._0_10_ = in_stack_ffffffffffffffe8;
  polynomial_00._12_4_ = in_stack_fffffffffffffff4;
  polynomial_destroy(polynomial_00);
  polynomial_01.order._2_2_ = in_stack_fffffffffffffff2;
  polynomial_01._0_10_ = in_stack_ffffffffffffffe8;
  polynomial_01._12_4_ = in_stack_fffffffffffffff4;
  polynomial_destroy(polynomial_01);
  if ((*(byte *)((long)in_RDI + 0x130) & 1) != 0) {
    free(*(void **)((long)in_RDI + 0x70));
    free(*(void **)((long)in_RDI + 0x78));
    polynomial_02.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_02._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_02._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_02);
    polynomial_03.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_03._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_03._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_03);
    polynomial_04.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_04._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_04._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_04);
    polynomial_05.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_05._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_05._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_05);
    free(*(void **)((long)in_RDI + 0xc0));
    free(*(void **)((long)in_RDI + 200));
    free(*(void **)((long)in_RDI + 0xd0));
    polynomial_06.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_06._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_06._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_06);
    polynomial_07.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_07._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_07._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_07);
    polynomial_08.order._2_2_ = in_stack_fffffffffffffff2;
    polynomial_08._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_08._12_4_ = in_stack_fffffffffffffff4;
    polynomial_destroy(polynomial_08);
    for (uVar2 = 0; (ulong)uVar2 < *(ulong *)((long)in_RDI + 0x10); uVar2 = uVar2 + 1) {
      free(*(void **)(*(long *)((long)in_RDI + 0x48) + (ulong)uVar2 * 8));
    }
    free(*(void **)((long)in_RDI + 0x48));
    for (uVar1 = 0; uVar1 < 0x100; uVar1 = uVar1 + 1) {
      free(*(void **)(*(long *)((long)in_RDI + 0xd8) + (ulong)uVar1 * 8));
    }
    free(*(void **)((long)in_RDI + 0xd8));
    polynomial_09.order._2_2_ = uVar1;
    polynomial_09._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_09._12_4_ = uVar2;
    polynomial_destroy(polynomial_09);
    polynomial_10.order._2_2_ = uVar1;
    polynomial_10._0_10_ = in_stack_ffffffffffffffe8;
    polynomial_10._12_4_ = uVar2;
    polynomial_destroy(polynomial_10);
  }
  free(in_RDI);
  return;
}

Assistant:

void correct_reed_solomon_destroy(correct_reed_solomon *rs) {
    field_destroy(rs->field);
    polynomial_destroy(rs->generator);
    free(rs->generator_roots);
    polynomial_destroy(rs->encoded_polynomial);
    polynomial_destroy(rs->encoded_remainder);
    if (rs->has_init_decode) {
        free(rs->syndromes);
        free(rs->modified_syndromes);
        polynomial_destroy(rs->received_polynomial);
        polynomial_destroy(rs->error_locator);
        polynomial_destroy(rs->error_locator_log);
        polynomial_destroy(rs->erasure_locator);
        free(rs->error_roots);
        free(rs->error_vals);
        free(rs->error_locations);
        polynomial_destroy(rs->last_error_locator);
        polynomial_destroy(rs->error_evaluator);
        polynomial_destroy(rs->error_locator_derivative);
        for (unsigned int i = 0; i < rs->min_distance; i++) {
            free(rs->generator_root_exp[i]);
        }
        free(rs->generator_root_exp);
        for (field_operation_t i = 0; i < 256; i++) {
            free(rs->element_exp[i]);
        }
        free(rs->element_exp);
        polynomial_destroy(rs->init_from_roots_scratch[0]);
        polynomial_destroy(rs->init_from_roots_scratch[1]);
    }
    free(rs);
}